

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mouse_cursor.c
# Opt level: O2

void al_destroy_mouse_cursor(ALLEGRO_MOUSE_CURSOR *cursor)

{
  ALLEGRO_SYSTEM *pAVar1;
  
  if (cursor != (ALLEGRO_MOUSE_CURSOR *)0x0) {
    pAVar1 = al_get_system_driver();
    (*pAVar1->vt->destroy_mouse_cursor)(cursor);
    return;
  }
  return;
}

Assistant:

void al_destroy_mouse_cursor(ALLEGRO_MOUSE_CURSOR *cursor)
{
   ALLEGRO_SYSTEM *sysdrv;

   if (!cursor) {
      return;
   }

   sysdrv = al_get_system_driver();

   ASSERT(sysdrv->vt->destroy_mouse_cursor);
   sysdrv->vt->destroy_mouse_cursor(cursor);
}